

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::setValue
          (DateTimePickerPrivate *this,QDateTime *dt,bool updateIndexes)

{
  Type TVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  qsizetype qVar5;
  const_reference pSVar6;
  reference pSVar7;
  int local_20;
  int i;
  bool updateIndexes_local;
  QDateTime *dt_local;
  DateTimePickerPrivate *this_local;
  
  bVar2 = ::operator!=(&this->value,dt);
  if (bVar2) {
    bVar2 = operator>=(dt,&this->minimum);
    if ((bVar2) && (bVar2 = operator<=(dt,&this->maximum), bVar2)) {
      QDateTime::operator=(&this->value,dt);
    }
    else {
      bVar2 = operator<(dt,&this->minimum);
      if (bVar2) {
        QDateTime::operator=(&this->value,&this->minimum);
      }
      else {
        bVar2 = operator>(dt,&this->maximum);
        if (bVar2) {
          QDateTime::operator=(&this->value,&this->maximum);
        }
      }
    }
    fillValues(this,updateIndexes);
    if ((updateIndexes) || (bVar2 = ::operator!=(&this->value,dt), bVar2)) {
      for (local_20 = 0;
          qVar5 = QList<QtMWidgets::Section>::size(&(this->super_DateTimeParser).sections),
          local_20 < qVar5; local_20 = local_20 + 1) {
        pSVar6 = QList<QtMWidgets::Section>::at
                           (&(this->super_DateTimeParser).sections,(long)local_20);
        TVar1 = pSVar6->type;
        if (TVar1 == AmPmSection) {
          QDateTime::time();
          iVar3 = QTime::hour();
          bVar2 = true;
          if (iVar3 != 0) {
            QDateTime::time();
            iVar3 = QTime::hour();
            bVar2 = 0xc < iVar3;
          }
          if (bVar2) {
            pSVar7 = QList<QtMWidgets::Section>::operator[]
                               (&(this->super_DateTimeParser).sections,(long)local_20);
            pSVar7->currentIndex = 1;
          }
          else {
            pSVar7 = QList<QtMWidgets::Section>::operator[]
                               (&(this->super_DateTimeParser).sections,(long)local_20);
            pSVar7->currentIndex = 0;
          }
        }
        else if (TVar1 == SecondSection) {
          QDateTime::time();
          iVar3 = QTime::second();
          pSVar7 = QList<QtMWidgets::Section>::operator[]
                             (&(this->super_DateTimeParser).sections,(long)local_20);
          pSVar7->currentIndex = iVar3;
        }
        else if (TVar1 == MinuteSection) {
          QDateTime::time();
          iVar3 = QTime::minute();
          pSVar7 = QList<QtMWidgets::Section>::operator[]
                             (&(this->super_DateTimeParser).sections,(long)local_20);
          pSVar7->currentIndex = iVar3;
        }
        else if (TVar1 == Hour12Section) {
          QDateTime::time();
          iVar3 = QTime::hour();
          if (iVar3 == 0) {
            pSVar7 = QList<QtMWidgets::Section>::operator[]
                               (&(this->super_DateTimeParser).sections,(long)local_20);
            pSVar7->currentIndex = 0xb;
          }
          else {
            QDateTime::time();
            iVar3 = QTime::hour();
            if (iVar3 < 0xd) {
              QDateTime::time();
              iVar3 = QTime::hour();
              pSVar7 = QList<QtMWidgets::Section>::operator[]
                                 (&(this->super_DateTimeParser).sections,(long)local_20);
              pSVar7->currentIndex = iVar3 + -1;
            }
            else {
              QDateTime::time();
              iVar3 = QTime::hour();
              pSVar7 = QList<QtMWidgets::Section>::operator[]
                                 (&(this->super_DateTimeParser).sections,(long)local_20);
              pSVar7->currentIndex = iVar3 + -0xd;
            }
          }
        }
        else if (TVar1 == Hour24Section) {
          QDateTime::time();
          iVar3 = QTime::hour();
          pSVar7 = QList<QtMWidgets::Section>::operator[]
                             (&(this->super_DateTimeParser).sections,(long)local_20);
          pSVar7->currentIndex = iVar3;
        }
        else if (((TVar1 == DaySection) || (TVar1 == DaySectionShort)) || (TVar1 == DaySectionLong))
        {
          QDateTime::date();
          iVar3 = QDate::day();
          pSVar7 = QList<QtMWidgets::Section>::operator[]
                             (&(this->super_DateTimeParser).sections,(long)local_20);
          pSVar7->currentIndex = iVar3 + -1;
        }
        else if (((TVar1 == MonthSection) || (TVar1 == MonthSectionShort)) ||
                (TVar1 == MonthSectionLong)) {
          QDateTime::date();
          iVar3 = QDate::month();
          pSVar7 = QList<QtMWidgets::Section>::operator[]
                             (&(this->super_DateTimeParser).sections,(long)local_20);
          pSVar7->currentIndex = iVar3 + -1;
        }
        else if ((TVar1 == YearSection) || (TVar1 == YearSection2Digits)) {
          QDateTime::date();
          iVar3 = QDate::year();
          QDateTime::date();
          iVar4 = QDate::year();
          pSVar7 = QList<QtMWidgets::Section>::operator[]
                             (&(this->super_DateTimeParser).sections,(long)local_20);
          pSVar7->currentIndex = iVar3 - iVar4;
        }
      }
    }
    emitSignals(this);
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::setValue( const QDateTime & dt, bool updateIndexes )
{
	if( value != dt )
	{
		if( dt >= minimum && dt <= maximum )
			value = dt;
		else if( dt < minimum )
			value = minimum;
		else if( dt > maximum )
			value = maximum;

		fillValues( updateIndexes );

		if( updateIndexes || value != dt )
		{
			for( int i = 0; i < sections.size(); ++i )
			{
				switch( sections.at( i ).type )
				{
					case Section::AmPmSection :
					{
						if( value.time().hour() == 0 ||
							value.time().hour() > 12 )
								sections[ i ].currentIndex = 1;
						else
							sections[ i ].currentIndex = 0;
					}
					break;

					case Section::SecondSection :
					{
						sections[ i ].currentIndex = value.time().second();
					}
					break;

					case Section::MinuteSection :
					{
						sections[ i ].currentIndex = value.time().minute();
					}
					break;

					case Section::Hour12Section :
					{
						if( value.time().hour() == 0 )
							sections[ i ].currentIndex = 11;
						else if( value.time().hour() > 12 )
							sections[ i ].currentIndex = value.time().hour() - 12 - 1;
						else
							sections[ i ].currentIndex = value.time().hour() - 1;
					}
					break;

					case Section::Hour24Section :
					{
						sections[ i ].currentIndex = value.time().hour();
					}
					break;

					case Section::DaySection :
					case Section::DaySectionShort :
					case Section::DaySectionLong :
					{
						sections[ i ].currentIndex = value.date().day() - 1;
					}
					break;

					case Section::MonthSection :
					case Section::MonthSectionShort :
					case Section::MonthSectionLong :
					{
						sections[ i ].currentIndex = value.date().month() - 1;
					}
					break;

					case Section::YearSection :
					case Section::YearSection2Digits :
					{
						sections[ i ].currentIndex = value.date().year() -
							minimum.date().year();
					}
					break;

					default:
						break;
				}
			}
		}

		emitSignals();
	}
}